

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_ops.h
# Opt level: O0

vec<float,_2UL> hmi::operator/(vec<float,_2UL> lhs,int rhs)

{
  float fVar1;
  float *pfVar2;
  int in_EDI;
  size_t i;
  vec<float,_2UL> result;
  ulong local_20;
  vec<float,_2UL> local_10;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_8;
  
  vec<float,_2UL>::vec((vec<float,_2UL> *)&local_8.x);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    pfVar2 = vec<float,_2UL>::operator[](&local_10,local_20);
    fVar1 = *pfVar2;
    pfVar2 = vec<float,_2UL>::operator[]((vec<float,_2UL> *)&local_8.x,local_20);
    *pfVar2 = fVar1 / (float)in_EDI;
  }
  return (vec<float,_2UL>)local_8;
}

Assistant:

constexpr
  vec<std::common_type_t<T,U>,N> operator/(vec<T,N> lhs, U rhs) noexcept {
    vec<std::common_type_t<T,U>,N> result;

    for (std::size_t i = 0; i < N; ++i) {
      result[i] = lhs[i] / rhs;
    }

    return result;
  }